

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::columnCountChanged(QTableView *this,int param_2,int param_3)

{
  ScrollMode SVar1;
  QTableViewPrivate *this_00;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  QTableViewPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  QAbstractItemView *in_stack_ffffffffffffffd0;
  QHeaderView *this_01;
  int iVar2;
  
  this_00 = d_func((QTableView *)0x8b6344);
  (**(code **)(*in_RDI + 0x268))();
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  SVar1 = QAbstractItemView::horizontalScrollMode(in_stack_ffffffffffffffd0);
  if (SVar1 == ScrollPerItem) {
    QAbstractScrollArea::horizontalScrollBar(&in_stack_ffffffffffffffd0->super_QAbstractScrollArea);
    iVar2 = (int)((ulong)this_00 >> 0x20);
    QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffffd0);
    QHeaderView::setOffsetToSectionPosition((QHeaderView *)CONCAT44(in_ESI,in_EDX),iVar2);
  }
  else {
    this_01 = this_00->horizontalHeader;
    QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_01);
    QAbstractSlider::value((QAbstractSlider *)this_01);
    QHeaderView::setOffset((QHeaderView *)this_00,iVar2);
  }
  QWidget::update(in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void QTableView::columnCountChanged(int, int)
{
    Q_D(QTableView);
    updateGeometries();
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem)
        d->horizontalHeader->setOffsetToSectionPosition(horizontalScrollBar()->value());
    else
        d->horizontalHeader->setOffset(horizontalScrollBar()->value());
    d->viewport->update();
}